

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrsIntersect.cpp
# Opt level: O0

bool GeoCalcs::CrsIntersect
               (LLPoint *llPt1,double az13,LLPoint *llPt2,double az23,double dTol,
               LLPoint *llIntersect)

{
  bool bVar1;
  double local_58;
  double dist23;
  double az32;
  double dist13;
  double az31;
  LLPoint *llIntersect_local;
  double dTol_local;
  double az23_local;
  LLPoint *llPt2_local;
  double az13_local;
  LLPoint *llPt1_local;
  
  dist23 = 0.0;
  dist13 = 0.0;
  local_58 = 0.0;
  az32 = 0.0;
  az31 = (double)llIntersect;
  llIntersect_local = (LLPoint *)dTol;
  dTol_local = az23;
  az23_local = (double)llPt2;
  llPt2_local = (LLPoint *)az13;
  az13_local = (double)llPt1;
  bVar1 = CrsIntersect(llPt1,az13,&dist13,&az32,llPt2,az23,&dist23,&local_58,dTol,llIntersect);
  return bVar1;
}

Assistant:

bool CrsIntersect(const LLPoint &llPt1, double az13,
                      const LLPoint &llPt2, double az23, double dTol, LLPoint &llIntersect)
    {
        double az31, dist13, az32, dist23;
        az31 = az32 = 0.0;
        dist13 = dist23 = 0.0;
        return CrsIntersect(llPt1, az13, az31, dist13,
                            llPt2, az23, az32, dist23,
                            dTol, llIntersect);

    }